

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm_ldst.h
# Opt level: O2

uint16_t arm_lduw_code(CPUARMState_conflict *env,target_ulong addr,_Bool sctlr_b)

{
  uint32_t uVar1;
  ushort uVar2;
  undefined3 in_register_00000011;
  
  uVar1 = cpu_lduw_code_aarch64(env,addr);
  uVar2 = (ushort)uVar1;
  if (CONCAT31(in_register_00000011,sctlr_b) != 0) {
    uVar2 = uVar2 << 8 | uVar2 >> 8;
  }
  return uVar2;
}

Assistant:

static inline uint16_t arm_lduw_code(CPUARMState *env, target_ulong addr,
                                     bool sctlr_b)
{
    TCGContext *tcg_ctx = env->uc->tcg_ctx;
    /* In big-endian (BE32) mode, adjacent Thumb instructions have been swapped
       within each word.  Undo that now.  */
    // Unicorn: Note that we don't have any loader so this patch makes no sense.
    //          And sctlr_b is 0 in aarch64.
    // if (sctlr_b) {
    //     addr ^= 2;
    // }
    return translator_lduw_swap(tcg_ctx, env, addr, bswap_code(sctlr_b));
}